

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::QueryCase::iterate(QueryCase *this)

{
  undefined8 *puVar1;
  ostream *poVar2;
  TestLog *log;
  long lVar3;
  undefined8 uVar4;
  int i;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  pointer pBVar7;
  ulong uVar8;
  pointer pBVar9;
  pointer pBVar10;
  long *plVar11;
  int i_1;
  ulong uVar12;
  size_type *psVar13;
  pointer pBVar14;
  int ndx_1;
  float *pfVar15;
  bool bVar16;
  pointer pBVar17;
  size_t __n;
  char *pcVar18;
  int coordNdx;
  long lVar19;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  *this_00;
  int ndx_6;
  bool bVar20;
  float fVar21;
  float fVar22;
  CallLogWrapper gl;
  ScopedLogSection section;
  StateQueryMemoryWriteGuard<float[8]> state;
  BoundingBox boundingBox;
  Random rnd;
  pointer local_378;
  pointer local_360;
  string local_358;
  CallLogWrapper local_338;
  ScopedLogSection local_320;
  Enum<int,_1UL> local_318;
  long local_308 [2];
  undefined1 local_2f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  long local_2c8;
  long lStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  long local_2a8;
  long lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [4];
  long local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  ios_base local_1b8 [8];
  ios_base local_1b0 [272];
  Enum<int,_1UL> local_a0;
  Enum<int,_1UL> local_90;
  Enum<int,_1UL> local_80;
  Enum<int,_1UL> local_70;
  Enum<int,_1UL> local_60;
  Enum<int,_1UL> local_50;
  deRandom local_40;
  
  if ((anonymous_namespace)::QueryCase::iterate()::fixedCases == '\0') {
    _GLOBAL__N_1::QueryCase::iterate();
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_338,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  __n = 0xde3210;
  deRandom_init(&local_40,0xde3210);
  pBVar7 = std::
           _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
           ::_M_allocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                          *)0x6,__n);
  lVar19 = 0;
  do {
    uVar4 = *(undefined8 *)((long)iterate::fixedCases[0].min.m_data + lVar19 + 8);
    puVar1 = (undefined8 *)((long)(pBVar7->min).m_data + lVar19);
    *puVar1 = *(undefined8 *)((long)iterate::fixedCases[0].min.m_data + lVar19);
    puVar1[1] = uVar4;
    uVar4 = *(undefined8 *)((long)iterate::fixedCases[0].max.m_data + lVar19 + 8);
    puVar1 = (undefined8 *)((long)(pBVar7->max).m_data + lVar19);
    *puVar1 = *(undefined8 *)((long)iterate::fixedCases[0].max.m_data + lVar19);
    puVar1[1] = uVar4;
    bVar20 = lVar19 != 0xa0;
    lVar19 = lVar19 + 0x20;
  } while (bVar20);
  local_360 = pBVar7 + 6;
  pBVar14 = pBVar7 + 1 + 5;
  iVar5 = 0;
  local_378 = pBVar7;
  do {
    local_218 = 0;
    uStack_210 = 0;
    pfVar15 = (float *)local_228;
    local_228._0_8_ = (TestLog *)0x0;
    local_228._8_8_ = 0;
    lVar19 = 0;
    do {
      fVar21 = deRandom_getFloat(&local_40);
      *pfVar15 = fVar21 * 8.0 + -4.0;
      lVar19 = lVar19 + 1;
      pfVar15 = pfVar15 + 1;
    } while (lVar19 != 8);
    if (pBVar14 == local_360) {
      lVar19 = (long)pBVar14 - (long)local_378;
      if (lVar19 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = lVar19 >> 5;
      uVar12 = uVar8 + (uVar8 == 0);
      this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                 *)(uVar12 + uVar8);
      if ((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
           *)0x3fffffffffffffe < this_00) {
        this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                   *)0x3ffffffffffffff;
      }
      if (CARRY8(uVar12,uVar8)) {
        this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                   *)0x3ffffffffffffff;
      }
      pBVar9 = std::
               _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
               ::_M_allocate(this_00,(size_t)pBVar7);
      *(undefined8 *)((long)pBVar9 + lVar19) = local_228._0_8_;
      ((undefined8 *)((long)pBVar9 + lVar19))[1] = local_228._8_8_;
      puVar1 = (undefined8 *)((long)pBVar9 + lVar19 + 0x10);
      *puVar1 = local_218;
      puVar1[1] = uStack_210;
      pBVar17 = pBVar9;
      for (pBVar10 = local_378; pBVar10 != pBVar14; pBVar10 = pBVar10 + 1) {
        lVar19 = 0;
        do {
          (pBVar17->min).m_data[lVar19] = (pBVar10->min).m_data[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
        lVar19 = 4;
        do {
          (pBVar17->min).m_data[lVar19] = (pBVar10->min).m_data[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 8);
        pBVar17 = pBVar17 + 1;
      }
      if (local_378 != (pointer)0x0) {
        pBVar7 = (pointer)((long)local_360 - (long)local_378);
        operator_delete(local_378,(ulong)pBVar7);
      }
      local_360 = pBVar9 + (long)this_00;
      pBVar14 = pBVar17;
      local_378 = pBVar9;
    }
    else {
      lVar19 = 0;
      do {
        (pBVar14->min).m_data[lVar19] = *(float *)(local_228 + lVar19 * 4);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      lVar19 = 4;
      do {
        (pBVar14->min).m_data[lVar19] = *(float *)(local_228 + lVar19 * 4);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
    }
    pBVar14 = pBVar14 + 1;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 9);
  local_338.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  iVar5 = (int)((ulong)((long)pBVar14 - (long)local_378) >> 5);
  if (0 < iVar5) {
    local_238 = (long)iVar5;
    lVar19 = 0;
    pBVar7 = local_378;
    do {
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2f8._0_8_ = local_2f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Iteration","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      local_230 = lVar19 + 1;
      std::ostream::operator<<((ostringstream *)local_228,(int)local_230);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
      std::ios_base::~ios_base((ios_base *)(local_228 + 0x70));
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,0x98991e);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_358.field_2._M_allocated_capacity = *psVar13;
        local_358.field_2._8_8_ = plVar11[3];
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      }
      else {
        local_358.field_2._M_allocated_capacity = *psVar13;
        local_358._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_358._M_string_length = plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&local_320,log,(string *)local_2f8,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if (local_318.m_getName != (GetNameFunc)local_308) {
        operator_delete(local_318.m_getName,local_308[0] + 1);
      }
      if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
        operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
      }
      glu::CallLogWrapper::glPrimitiveBoundingBox
                (&local_338,local_378[lVar19].min.m_data[0],local_378[lVar19].min.m_data[1],
                 local_378[lVar19].min.m_data[2],local_378[lVar19].min.m_data[3],
                 local_378[lVar19].max.m_data[0],local_378[lVar19].max.m_data[1],
                 local_378[lVar19].max.m_data[2],local_378[lVar19].max.m_data[3]);
      switch(this->m_method) {
      case QUERY_FLOAT:
        local_2a8 = -0x2121212121212122;
        lStack_2a0 = -0x2121212121212122;
        local_2b8._M_allocated_capacity = 0xdededededededede;
        local_2b8._8_4_ = -8.0297587e+18;
        local_2b8._12_4_ = -8.0297587e+18;
        local_2c8 = -0x2121212121212122;
        lStack_2c0 = -0x2121212121212122;
        local_2d8._M_allocated_capacity = 0xdededededededede;
        local_2d8._8_8_ = 0xdededededededede;
        local_2f8._16_8_ = 0xdededededededede;
        local_2f8._24_8_ = 0xdededededededede;
        local_2f8._0_8_ = (pointer)0xdededededededede;
        local_2f8[8] = 0xde;
        local_2f8[9] = 0xde;
        local_2f8[10] = 0xde;
        local_2f8[0xb] = 0xde;
        local_2f8[0xc] = 0xde;
        local_2f8[0xd] = 0xde;
        local_2f8[0xe] = 0xde;
        local_2f8[0xf] = 0xde;
        glu::CallLogWrapper::glGetFloatv(&local_338,0x92be,(GLfloat *)&local_2d8);
        GVar6 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar6,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x138);
        bVar20 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::verifyValidity
                           ((StateQueryMemoryWriteGuard<float[8]> *)local_2f8,
                            (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (bVar20) {
          local_228._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 8),"glGetFloatv returned ",0x15);
          local_358._M_dataplus._M_p = (pointer)&local_2d8;
          local_358._M_string_length = (size_type)&local_2b8;
          tcu::Format::operator<<((ostream *)(local_228 + 8),(Array<float_*> *)&local_358);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          pBVar17 = local_378 + lVar19;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 8));
          std::ios_base::~ios_base(local_1b0);
          lVar19 = 0;
          bVar20 = false;
          pBVar14 = pBVar7;
          do {
            fVar21 = *(float *)((long)&local_2d8 + lVar19 * 4);
            if (fVar21 != (pBVar14->min).m_data[0]) {
              bVar20 = true;
            }
            if (NAN(fVar21) || NAN((pBVar14->min).m_data[0])) {
              bVar20 = true;
            }
            lVar19 = lVar19 + 1;
            pBVar14 = (pointer)((pBVar14->min).m_data + 1);
          } while (lVar19 != 8);
          bVar16 = true;
          if (!bVar20) goto LAB_006199b7;
          local_228._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
          poVar2 = (ostream *)(local_228 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,"Error, unexpected value\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Expected [",10);
          std::ostream::_M_insert<double>((double)(pBVar17->min).m_data[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar17->min).m_data[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar17->min).m_data[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar17->min).m_data[3]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar17->max).m_data[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar17->max).m_data[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar17->max).m_data[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          std::ostream::_M_insert<double>((double)(pBVar17->max).m_data[3]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00619261:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 8));
          std::ios_base::~ios_base(local_1b0);
        }
        break;
      case QUERY_BOOLEAN:
        local_2f8._16_8_ = 0xdededededededede;
        local_2f8._0_8_ = (pointer)0xdededededededede;
        local_2f8[8] = 0xde;
        local_2f8[9] = 0xde;
        local_2f8[10] = 0xde;
        local_2f8[0xb] = 0xde;
        local_2f8[0xc] = 0xde;
        local_2f8[0xd] = 0xde;
        local_2f8[0xe] = 0xde;
        local_2f8[0xf] = 0xde;
        glu::CallLogWrapper::glGetBooleanv(&local_338,0x92be,local_2f8 + 8);
        GVar6 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar6,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x1bc);
        bVar20 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[8]>::verifyValidity
                           ((StateQueryMemoryWriteGuard<unsigned_char[8]> *)local_2f8,
                            (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (!bVar20) break;
        local_228._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
        poVar2 = (ostream *)(local_228 + 8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"glGetBooleanv returned [",0x18);
        local_358._M_dataplus._M_p = (pointer)glu::getBooleanName;
        local_358._M_string_length = CONCAT44(local_358._M_string_length._4_4_,(uint)local_2f8[8]);
        tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)&local_358,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        local_318.m_getName = glu::getBooleanName;
        local_318.m_value = (int)local_2f8[9];
        tcu::Format::Enum<int,_1UL>::toStream(&local_318,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        local_50.m_getName = glu::getBooleanName;
        local_50.m_value = (int)local_2f8[10];
        tcu::Format::Enum<int,_1UL>::toStream(&local_50,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        local_60.m_getName = glu::getBooleanName;
        local_60.m_value = (int)local_2f8[0xb];
        tcu::Format::Enum<int,_1UL>::toStream(&local_60,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        local_70.m_getName = glu::getBooleanName;
        local_70.m_value = (int)local_2f8[0xc];
        tcu::Format::Enum<int,_1UL>::toStream(&local_70,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        local_80.m_getName = glu::getBooleanName;
        local_80.m_value = (int)local_2f8[0xd];
        tcu::Format::Enum<int,_1UL>::toStream(&local_80,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        local_90.m_getName = glu::getBooleanName;
        local_90.m_value = (int)local_2f8[0xe];
        tcu::Format::Enum<int,_1UL>::toStream(&local_90,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        local_a0.m_getName = glu::getBooleanName;
        local_a0.m_value = (int)local_2f8[0xf];
        tcu::Format::Enum<int,_1UL>::toStream(&local_a0,poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 8),"]\n",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 8));
        std::ios_base::~ios_base(local_1b0);
        lVar19 = 0;
        bVar20 = false;
        pBVar14 = pBVar7;
        do {
          if ((bool)local_2f8[lVar19 + 8] != ((pBVar14->min).m_data[0] != 0.0)) {
            bVar20 = true;
          }
          lVar19 = lVar19 + 1;
          pBVar14 = (pointer)((pBVar14->min).m_data + 1);
        } while (lVar19 != 8);
        bVar16 = true;
        if (bVar20) {
          local_228._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 8),"Error, unexpected value\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 8),"Expected [",10);
          lVar19 = 0;
          pBVar14 = pBVar7;
          do {
            if (lVar19 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 8),", ",2);
            }
            fVar21 = (pBVar14->min).m_data[0];
            pcVar18 = "GL_FALSE";
            if (fVar21 != 0.0) {
              pcVar18 = "GL_TRUE";
            }
            if (NAN(fVar21)) {
              pcVar18 = "GL_TRUE";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 8),pcVar18,8 - (ulong)(-(uint)(fVar21 != 0.0) & 1));
            lVar19 = lVar19 + 1;
            pBVar14 = (pointer)((pBVar14->min).m_data + 1);
          } while (lVar19 != 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 8),"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0061998b:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 8));
          std::ios_base::~ios_base(local_1b0);
          bVar16 = false;
        }
        goto LAB_006199b7;
      case QUERY_INT:
        local_2a8 = -0x2121212121212122;
        lStack_2a0 = -0x2121212121212122;
        local_2b8._M_allocated_capacity = 0xdededededededede;
        local_2b8._8_4_ = -8.0297587e+18;
        local_2b8._12_4_ = -8.0297587e+18;
        local_2c8 = -0x2121212121212122;
        lStack_2c0 = -0x2121212121212122;
        local_2d8._M_allocated_capacity = 0xdededededededede;
        local_2d8._8_8_ = 0xdededededededede;
        local_2f8._16_8_ = 0xdededededededede;
        local_2f8._24_8_ = 0xdededededededede;
        local_2f8._0_8_ = (pointer)0xdededededededede;
        local_2f8[8] = 0xde;
        local_2f8[9] = 0xde;
        local_2f8[10] = 0xde;
        local_2f8[0xb] = 0xde;
        local_2f8[0xc] = 0xde;
        local_2f8[0xd] = 0xde;
        local_2f8[0xe] = 0xde;
        local_2f8[0xf] = 0xde;
        glu::CallLogWrapper::glGetIntegerv(&local_338,0x92be,(GLint *)local_2d8._M_local_buf);
        GVar6 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar6,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x15a);
        bVar20 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[8]>::verifyValidity
                           ((StateQueryMemoryWriteGuard<int[8]> *)local_2f8,
                            (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (bVar20) {
          local_228._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 8),"glGetIntegerv returned ",0x17);
          local_358._M_dataplus._M_p = (pointer)&local_2d8;
          local_358._M_string_length = (size_type)&local_2b8;
          tcu::Format::operator<<((ostream *)(local_228 + 8),(Array<int_*> *)&local_358);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 8));
          std::ios_base::~ios_base(local_1b0);
          lVar19 = 0;
          bVar16 = false;
          bVar20 = false;
          pBVar14 = pBVar7;
          do {
            iVar5 = *(int *)((long)&local_2d8 + lVar19 * 4);
            fVar21 = (pBVar14->min).m_data[0];
            fVar22 = ceilf(fVar21 + -0.5);
            if ((iVar5 != (int)fVar22) &&
               (fVar21 = floorf(fVar21 + 0.5), bVar20 = bVar16, iVar5 != (int)fVar21)) {
              bVar16 = true;
              bVar20 = true;
            }
            lVar19 = lVar19 + 1;
            pBVar14 = (pointer)((pBVar14->min).m_data + 1);
          } while (lVar19 != 8);
          bVar16 = true;
          if (bVar20) {
            local_228._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 8),"Error, unexpected value\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 8),"Expected [",10);
            lVar19 = 0;
            pBVar14 = pBVar7;
            do {
              fVar21 = (pBVar14->min).m_data[0];
              fVar22 = ceilf(fVar21 + -0.5);
              fVar21 = floorf(fVar21 + 0.5);
              if (lVar19 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_228 + 8),", ",2);
              }
              iVar5 = (int)fVar22;
              if (iVar5 == (int)fVar21) {
                std::ostream::operator<<(local_228 + 8,iVar5);
              }
              else {
                poVar2 = (ostream *)(local_228 + 8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{",1);
                std::ostream::operator<<(poVar2,iVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
                std::ostream::operator<<(poVar2,(int)fVar21);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
              }
              lVar19 = lVar19 + 1;
              pBVar14 = (pointer)((pBVar14->min).m_data + 1);
            } while (lVar19 != 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 8),"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00619261;
          }
          goto LAB_006199b7;
        }
        break;
      case QUERY_INT64:
        memset(local_2f8,0xde,0xc0);
        glu::CallLogWrapper::glGetInteger64v(&local_338,0x92be,(GLint64 *)local_2b8._M_local_buf);
        GVar6 = glu::CallLogWrapper::glGetError(&local_338);
        glu::checkError(GVar6,"query",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                        ,0x18b);
        bVar20 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[8]>::verifyValidity
                           ((StateQueryMemoryWriteGuard<long[8]> *)local_2f8,
                            (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if (bVar20) {
          local_228._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_228 + 8),"glGetInteger64v returned ",0x19);
          local_358._M_dataplus._M_p = (pointer)&local_2b8;
          local_358._M_string_length = (size_type)local_278;
          tcu::Format::operator<<((ostream *)(local_228 + 8),(Array<long_*> *)&local_358);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 8));
          std::ios_base::~ios_base(local_1b0);
          lVar19 = 0;
          bVar16 = false;
          bVar20 = false;
          pBVar14 = pBVar7;
          do {
            lVar3 = *(long *)((long)&local_2b8 + lVar19 * 8);
            fVar21 = (pBVar14->min).m_data[0];
            fVar22 = ceilf(fVar21 + -0.5);
            if ((lVar3 != (long)fVar22) &&
               (fVar21 = floorf(fVar21 + 0.5), bVar20 = bVar16, lVar3 != (long)fVar21)) {
              bVar16 = true;
              bVar20 = true;
            }
            lVar19 = lVar19 + 1;
            pBVar14 = (pointer)((pBVar14->min).m_data + 1);
          } while (lVar19 != 8);
          bVar16 = true;
          if (bVar20) {
            local_228._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_228 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 8),"Error, unexpected value\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_228 + 8),"Expected [",10);
            lVar19 = 0;
            pBVar14 = pBVar7;
            do {
              fVar21 = (pBVar14->min).m_data[0];
              fVar22 = ceilf(fVar21 + -0.5);
              fVar21 = floorf(fVar21 + 0.5);
              if (lVar19 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_228 + 8),", ",2);
              }
              if ((long)fVar22 == (long)fVar21) {
                std::ostream::_M_insert<long>((long)(local_228 + 8));
              }
              else {
                poVar2 = (ostream *)(local_228 + 8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{",1);
                std::ostream::_M_insert<long>((long)poVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
                std::ostream::_M_insert<long>((long)poVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
              }
              lVar19 = lVar19 + 1;
              pBVar14 = (pointer)((pBVar14->min).m_data + 1);
            } while (lVar19 != 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_228 + 8),"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0061998b;
          }
          goto LAB_006199b7;
        }
        break;
      default:
        goto switchD_00618c58_default;
      }
      bVar16 = false;
LAB_006199b7:
      if (!bVar16) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Unexpected query result");
      }
switchD_00618c58_default:
      tcu::TestLog::endSection(local_320.m_log);
      pBVar7 = pBVar7 + 1;
      lVar19 = local_230;
    } while (local_230 < local_238);
  }
  if (local_378 != (pointer)0x0) {
    operator_delete(local_378,(long)local_360 - (long)local_378);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_338);
  return STOP;
}

Assistant:

QueryCase::IterateResult QueryCase::iterate (void)
{
	static const BoundingBox fixedCases[] =
	{
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f) },
		{ tcu::Vec4(-0.0f, -0.0f, -0.0f, -0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f, -0.0f) },
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 1.0f,  1.0f,  1.0f, -1.0f) },
		{ tcu::Vec4( 2.0f,  2.0f,  2.0f,  2.0f), tcu::Vec4( 1.5f,  1.5f,  1.5f,  1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  1.0f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  0.3f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.2f) },
	};

	const int					numRandomCases	= 9;
	glu::CallLogWrapper			gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	de::Random					rnd				(0xDE3210);
	std::vector<BoundingBox>	cases;

	cases.insert(cases.begin(), DE_ARRAY_BEGIN(fixedCases), DE_ARRAY_END(fixedCases));
	for (int ndx = 0; ndx < numRandomCases; ++ndx)
	{
		BoundingBox	boundingBox;

		// parameter evaluation order is not guaranteed, cannot just do "max = (rand(), rand(), ...)
		for (int coordNdx = 0; coordNdx < 8; ++coordNdx)
			boundingBox.getComponentAccess(coordNdx) = rnd.getFloat(-4.0f, 4.0f);

		cases.push_back(boundingBox);
	}

	gl.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int caseNdx = 0; caseNdx < (int)cases.size(); ++caseNdx)
	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Iteration", "Iteration " + de::toString(caseNdx+1));
		const BoundingBox&			boundingBox	= cases[caseNdx];

		gl.glPrimitiveBoundingBox(boundingBox.min.x(), boundingBox.min.y(), boundingBox.min.z(), boundingBox.min.w(),
								  boundingBox.max.x(), boundingBox.max.y(), boundingBox.max.z(), boundingBox.max.w());

		if (!verifyState(gl, boundingBox))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected query result");
	}

	return STOP;
}